

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

string * __thiscall
cmCTestGIT::FindTopDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  size_type sVar1;
  bool bVar2;
  string *this_00;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string cdup;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_rev_parse;
  string local_120;
  string local_100;
  string git;
  OneLineParser rev_parse_out;
  OutputLogger rev_parse_err;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory);
  std::__cxx11::string::string
            ((string *)&git,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool
            );
  std::__cxx11::string::string((string *)&rev_parse_out,(string *)&git);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rev_parse_out.super_LineParser.Line._M_string_length,"rev-parse",
             (allocator<char> *)&rev_parse_err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rev_parse_out.Line1,"--show-cdup",(allocator<char> *)&cdup);
  __l._M_len = 3;
  __l._M_array = (iterator)&rev_parse_out;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&git_rev_parse,__l,(allocator_type *)&local_100);
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&rev_parse_out.super_LineParser.super_OutputParser._vptr_OutputParser + lVar3)
              );
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  cdup._M_dataplus._M_p = (pointer)&cdup.field_2;
  cdup._M_string_length = 0;
  cdup.field_2._M_local_buf[0] = '\0';
  OneLineParser::OneLineParser(&rev_parse_out,this,"rev-parse-out> ",&cdup);
  cmProcessTools::OutputLogger::OutputLogger
            (&rev_parse_err,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"rev-parse-err> ");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"",(allocator<char> *)&local_100);
  bVar2 = cmCTestVC::RunChild((cmCTestVC *)this,&git_rev_parse,(OutputParser *)&rev_parse_out,
                              (OutputParser *)&rev_parse_err,&local_120,UTF8);
  sVar1 = cdup._M_string_length;
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_120);
    if (sVar1 == 0) goto LAB_001f597a;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    cmsys::SystemTools::CollapseFullPath(&local_100,__return_storage_ptr__);
    this_00 = &local_100;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_00);
  }
  else {
    this_00 = &local_120;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_001f597a:
  cmProcessTools::LineParser::~LineParser(&rev_parse_err.super_LineParser);
  cmProcessTools::LineParser::~LineParser(&rev_parse_out.super_LineParser);
  std::__cxx11::string::~string((string *)&cdup);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&git_rev_parse);
  std::__cxx11::string::~string((string *)&git);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindTopDir()
{
  std::string top_dir = this->SourceDirectory;

  // Run "git rev-parse --show-cdup" to locate the top of the tree.
  std::string git = this->CommandLineTool;
  std::vector<std::string> git_rev_parse = { git, "rev-parse", "--show-cdup" };
  std::string cdup;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", cdup);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if (this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err, "",
                     cmProcessOutput::UTF8) &&
      !cdup.empty()) {
    top_dir += "/";
    top_dir += cdup;
    top_dir = cmSystemTools::CollapseFullPath(top_dir);
  }
  return top_dir;
}